

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O0

int32_t counts_index_for(hdr_histogram *h,int64_t value)

{
  int32_t iVar1;
  int32_t sub_bucket_index_00;
  int32_t sub_bucket_index;
  int32_t bucket_index;
  int64_t value_local;
  hdr_histogram *h_local;
  
  iVar1 = get_bucket_index(h,value);
  sub_bucket_index_00 = get_sub_bucket_index(value,iVar1,h->unit_magnitude);
  iVar1 = counts_index(h,iVar1,sub_bucket_index_00);
  return iVar1;
}

Assistant:

int32_t counts_index_for(const struct hdr_histogram* h, int64_t value)
{
    int32_t bucket_index     = get_bucket_index(h, value);
    int32_t sub_bucket_index = get_sub_bucket_index(value, bucket_index, h->unit_magnitude);

    return counts_index(h, bucket_index, sub_bucket_index);
}